

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

void sq_setreleasehook(HSQUIRRELVM v,SQInteger idx,SQRELEASEHOOK hook)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  long lVar3;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    lVar3 = 0x1a8;
  }
  else if (SVar1 == OT_USERDATA) {
    lVar3 = 0x40;
  }
  else {
    if (SVar1 != OT_INSTANCE) {
      return;
    }
    lVar3 = 0x48;
  }
  *(SQRELEASEHOOK *)
   ((long)&(((pSVar2->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
           super_SQRefCounted._vptr_SQRefCounted + lVar3) = hook;
  return;
}

Assistant:

void sq_setreleasehook(HSQUIRRELVM v,SQInteger idx,SQRELEASEHOOK hook)
{
    SQObjectPtr &ud=stack_get(v,idx);
    switch( type(ud) ) {
    case OT_USERDATA:   _userdata(ud)->_hook = hook;    break;
    case OT_INSTANCE:   _instance(ud)->_hook = hook;    break;
    case OT_CLASS:      _class(ud)->_hook = hook;       break;
    default: return;
    }
}